

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiPhraseFirstColumn(Fts5Context *pCtx,int iPhrase,Fts5PhraseIter *pIter,int *piCol)

{
  int iVar1;
  int local_58;
  int local_54;
  int local_50;
  int n_1;
  int i1;
  int n;
  Fts5Sorter *pSorter;
  Fts5Config *pConfig;
  Fts5Cursor *pCsr;
  u32 *puStack_28;
  int rc;
  int *piCol_local;
  Fts5PhraseIter *pIter_local;
  Fts5Context *pFStack_10;
  int iPhrase_local;
  Fts5Context *pCtx_local;
  
  pCsr._4_4_ = 0;
  pSorter = *(Fts5Sorter **)(*(long *)pCtx + 0x18);
  pConfig = (Fts5Config *)pCtx;
  puStack_28 = (u32 *)piCol;
  piCol_local = (int *)pIter;
  pIter_local._4_4_ = iPhrase;
  pFStack_10 = pCtx;
  if (pSorter[2].aIdx[0] == 2) {
    _i1 = *(long *)(pCtx + 0x48);
    if (_i1 == 0) {
      pCsr._4_4_ = sqlite3Fts5ExprPhraseCollist(*(Fts5Expr **)(pCtx + 0x40),iPhrase,&pIter->a,&n_1);
    }
    else {
      if (iPhrase == 0) {
        local_58 = 0;
      }
      else {
        local_58 = *(int *)(_i1 + 0x1c + (long)(iPhrase + -1) * 4);
      }
      local_50 = local_58;
      n_1 = *(int *)(_i1 + 0x1c + (long)iPhrase * 4) - local_58;
      pIter->a = (uchar *)(*(long *)(_i1 + 0x10) + (long)local_58);
    }
    if (pCsr._4_4_ == 0) {
      *(long *)(piCol_local + 2) = *(long *)piCol_local + (long)n_1;
      *puStack_28 = 0;
      fts5ApiPhraseNextColumn(pFStack_10,(Fts5PhraseIter *)piCol_local,(int *)puStack_28);
    }
  }
  else {
    pCsr._4_4_ = fts5CsrPoslist((Fts5Cursor *)pCtx,iPhrase,&pIter->a,&local_54);
    if (pCsr._4_4_ == 0) {
      *(long *)(piCol_local + 2) = *(long *)piCol_local + (long)local_54;
      if (local_54 < 1) {
        *puStack_28 = 0xffffffff;
      }
      else if (**(char **)piCol_local == '\x01') {
        iVar1 = sqlite3Fts5GetVarint32((uchar *)(*(long *)piCol_local + 1),puStack_28);
        *(long *)piCol_local = *(long *)piCol_local + (long)(iVar1 + 1);
      }
      else {
        *puStack_28 = 0;
      }
    }
  }
  return pCsr._4_4_;
}

Assistant:

static int fts5ApiPhraseFirstColumn(
  Fts5Context *pCtx, 
  int iPhrase, 
  Fts5PhraseIter *pIter, 
  int *piCol
){
  int rc = SQLITE_OK;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Config *pConfig = ((Fts5Table*)(pCsr->base.pVtab))->pConfig;

  if( pConfig->eDetail==FTS5_DETAIL_COLUMNS ){
    Fts5Sorter *pSorter = pCsr->pSorter;
    int n;
    if( pSorter ){
      int i1 = (iPhrase==0 ? 0 : pSorter->aIdx[iPhrase-1]);
      n = pSorter->aIdx[iPhrase] - i1;
      pIter->a = &pSorter->aPoslist[i1];
    }else{
      rc = sqlite3Fts5ExprPhraseCollist(pCsr->pExpr, iPhrase, &pIter->a, &n);
    }
    if( rc==SQLITE_OK ){
      pIter->b = &pIter->a[n];
      *piCol = 0;
      fts5ApiPhraseNextColumn(pCtx, pIter, piCol);
    }
  }else{
    int n;
    rc = fts5CsrPoslist(pCsr, iPhrase, &pIter->a, &n);
    if( rc==SQLITE_OK ){
      pIter->b = &pIter->a[n];
      if( n<=0 ){
        *piCol = -1;
      }else if( pIter->a[0]==0x01 ){
        pIter->a += 1 + fts5GetVarint32(&pIter->a[1], *piCol);
      }else{
        *piCol = 0;
      }
    }
  }

  return rc;
}